

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O2

bool __thiscall
glcts::GeometryShaderPrimitiveCounter::checkResult(GeometryShaderPrimitiveCounter *this,GLint *data)

{
  uint uVar1;
  bool bVar2;
  MessageBuilder *this_00;
  int iVar3;
  uint uVar4;
  uint *value;
  ulong uVar5;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  bVar2 = true;
  uVar1 = 0;
  while (uVar4 = uVar1, uVar4 < (this->m_testConfiguration).m_numberOfDrawnPrimitives) {
    iVar3 = this->m_nrVaryings * this->m_maxGeometryOutputVertices;
    uVar5 = (ulong)(iVar3 * uVar4);
    value = (uint *)(data + uVar5);
    for (; uVar1 = uVar4 + 1, uVar5 < iVar3 * (uVar4 + 1); uVar5 = uVar5 + 1) {
      if (*value != uVar4) {
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"Rendered value at index ");
        std::operator<<(&local_1a8,"[");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::operator<<(&local_1a8,"/");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::operator<<(&local_1a8,"]: ");
        this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(int *)value);
        std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>," != ")
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)&this_00->m_str);
        tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        bVar2 = false;
      }
      value = value + 1;
    }
  }
  return bVar2;
}

Assistant:

bool GeometryShaderPrimitiveCounter::checkResult(const glw::GLint* data)
{
	bool testPassed = true;

	for (unsigned int nDrawnPrimitive = 0; nDrawnPrimitive < m_testConfiguration.m_numberOfDrawnPrimitives;
		 nDrawnPrimitive++)
	{
		unsigned int nEmittedValuesPerPrimitive = m_maxGeometryOutputVertices * m_nrVaryings;

		for (unsigned int nValue = (nEmittedValuesPerPrimitive * (nDrawnPrimitive));
			 nValue < (nEmittedValuesPerPrimitive * (nDrawnPrimitive + 1)); nValue++)
		{
			if ((unsigned int)data[nValue] != nDrawnPrimitive)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered value at index "
								   << "[" << nValue << "/" << (m_testConfiguration.m_numberOfDrawnPrimitives *
															   m_maxGeometryOutputVertices * m_nrVaryings)
								   << "]: " << data[nValue] << " != " << nEmittedValuesPerPrimitive
								   << tcu::TestLog::EndMessage;

				testPassed = false;
			}
		} /* for (all values) */
	}	 /* for (all primitives) */

	return testPassed;
}